

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_history(CHAR_DATA *ch,char *argument)

{
  char *__src;
  PC_DATA *pPVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  CHAR_DATA *ch_00;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string buffer;
  char *local_3638 [2];
  char obuf [4608];
  char arg2 [4608];
  char arg1 [4608];
  
  pcVar4 = one_argument(argument,arg1);
  pcVar4 = one_argument(pcVar4,arg2);
  if (arg1[0] == '\0') {
    send_to_char("Syntax: history <character>          = read a character\'s history\n\r",ch);
    send_to_char("        history <character> + <info> = add to the temporary buffer\n\r",ch);
    send_to_char("        history <character> -        = remove the last line from the temporary buffer\n\r"
                 ,ch);
    send_to_char("        history <character> show     = shows the temporary buffer\n\r",ch);
    send_to_char("        history <character> add      = write the temporary buffer to their pfile\n\r"
                 ,ch);
    pcVar4 = "        history <character> clear    = clear a player\'s history (IMP ONLY)\n\r";
  }
  else {
    ch_00 = get_char_world(ch,arg1);
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char("They aren\'t here, attempting offline history...\n\r",ch);
      fmt.size_ = 0xc;
      fmt.data_ = (char *)0x11;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_3638;
      local_3638[0] = arg1;
      ::fmt::v9::vformat_abi_cxx11_(&buffer,(v9 *)"finger {} history",fmt,args);
      interpret(ch,buffer._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&buffer);
      return;
    }
    bVar2 = is_npc(ch_00);
    if (bVar2) {
      pcVar4 = "You can\'t history a mob.\n\r";
    }
    else {
      if ((ch_00->level < ch->level) || (iVar3 = get_trust(ch), 0x3b < iVar3)) {
        if (arg2[0] != '\0') {
          iVar3 = bcmp(arg2,"clear",6);
          if (iVar3 == 0) {
            bVar2 = IS_IMP(ch);
            if (!bVar2) {
              pcVar4 = "You are not permitted to complete that operation.\n\r";
              goto LAB_002cf34d;
            }
            ch_00->pcdata->history_buffer = (char *)0x0;
          }
          uVar7 = arg2._0_4_;
          if (arg2._0_4_ != 0x646461) {
            iVar3 = bcmp(arg2,"show",5);
            if (iVar3 != 0) {
              if ((short)uVar7 == 0x2b) {
                if (*pcVar4 == '\0') {
                  pcVar4 = "Add what?\n\r";
                  goto LAB_002cf34d;
                }
                obuf[0] = '\0';
                __src = ch_00->pcdata->temp_history_buffer;
                if (__src != (char *)0x0) {
                  strcat(obuf,__src);
                }
                smash_tilde(pcVar4);
                strcat(obuf,pcVar4);
                sVar5 = strlen(obuf);
                (obuf + sVar5)[0] = '\n';
                (obuf + sVar5)[1] = '\r';
                obuf[sVar5 + 2] = '\0';
                free_pstring(ch_00->pcdata->temp_history_buffer);
                pcVar4 = palloc_string(obuf);
                ch_00->pcdata->temp_history_buffer = pcVar4;
                show_temp_history(ch,ch_00);
                uVar7 = arg2._0_4_ & 0xffff;
              }
              if ((short)uVar7 != 0x2d) {
                return;
              }
              pPVar1 = ch_00->pcdata;
              pcVar4 = pPVar1->temp_history_buffer;
              if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
                pcVar4 = "No lines left to remove.\n\r";
                goto LAB_002cf34d;
              }
              strcpy(obuf,pcVar4);
              uVar6 = strlen(obuf);
              bVar2 = false;
              while (iVar3 = (int)uVar6, 0 < iVar3) {
                if (obuf[uVar6 & 0xffffffff] == '\r') {
                  if (bVar2) {
                    obuf[(uVar6 & 0xffffffff) + 1] = '\0';
                    goto LAB_002cf5ce;
                  }
                  iVar3 = iVar3 + -1;
                  bVar2 = true;
                }
                uVar6 = (ulong)(iVar3 - 1);
              }
              obuf[0] = '\0';
LAB_002cf5ce:
              free_pstring(pPVar1->temp_history_buffer);
              pcVar4 = palloc_string(obuf);
              ch_00->pcdata->temp_history_buffer = pcVar4;
            }
            show_temp_history(ch,ch_00);
            return;
          }
          pcVar4 = ch_00->pcdata->temp_history_buffer;
          if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
            pcVar4 = "The temporary buffer for that character is empty.\n\r";
            goto LAB_002cf34d;
          }
          add_history(ch,ch_00,pcVar4);
          free_pstring(ch_00->pcdata->temp_history_buffer);
          ch_00->pcdata->temp_history_buffer = (char *)0x0;
        }
        show_history(ch,ch_00);
        return;
      }
      pcVar4 = "Access denied.\n\r";
    }
  }
LAB_002cf34d:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_history(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_STRING_LENGTH];
	char arg2[MAX_STRING_LENGTH];
	char obuf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	int len;
	bool found = false;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: history <character>          = read a character's history\n\r", ch);
		send_to_char("        history <character> + <info> = add to the temporary buffer\n\r", ch);
		send_to_char("        history <character> -        = remove the last line from the temporary buffer\n\r", ch);
		send_to_char("        history <character> show     = shows the temporary buffer\n\r", ch);
		send_to_char("        history <character> add      = write the temporary buffer to their pfile\n\r", ch);
		send_to_char("        history <character> clear    = clear a player's history (IMP ONLY)\n\r", ch);
		return;
	}

	victim = get_char_world(ch,arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here, attempting offline history...\n\r", ch);
		auto buffer = fmt::format("finger {} history", arg1);
		interpret(ch, buffer.data());
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("You can't history a mob.\n\r", ch);
		return;
	}

	if (victim->level >= ch->level && get_trust(ch) < 60)
	{
		send_to_char("Access denied.\n\r", ch);
		return;
	}

	if (arg2[0] == '\0')
	{
		show_history(ch, victim);
		return;
	}

	if (!strcmp(arg2, "clear"))
	{
		if (!IS_IMP(ch))
		{
			send_to_char("You are not permitted to complete that operation.\n\r", ch);
			return;
		}

		victim->pcdata->history_buffer = nullptr;
	}

	if (!strcmp(arg2, "add"))
	{
		if (victim->pcdata->temp_history_buffer == nullptr || victim->pcdata->temp_history_buffer[0] == '\0')
		{
			send_to_char("The temporary buffer for that character is empty.\n\r", ch);
			return;
		}
		else
		{
			add_history(ch, victim, victim->pcdata->temp_history_buffer);

			free_pstring(victim->pcdata->temp_history_buffer);
			victim->pcdata->temp_history_buffer = nullptr;

			show_history(ch, victim);
		}

		return;
	}

	if (!strcmp(arg2, "show"))
	{
		show_temp_history(ch, victim);
		return;
	}

	if (!strcmp(arg2, "+"))
	{
		if (argument[0] != '\0')
		{
			obuf[0] = '\0';
			if (victim->pcdata->temp_history_buffer)
			{
				strcat(obuf, victim->pcdata->temp_history_buffer);
			}
			smash_tilde(argument);
			strcat(obuf, argument);
			strcat(obuf, "\n\r");

			free_pstring(victim->pcdata->temp_history_buffer);
			victim->pcdata->temp_history_buffer = palloc_string(obuf);
		}
		else
		{
			send_to_char("Add what?\n\r", ch);
			return;
		}

		show_temp_history(ch, victim);
	}

	if (!strcmp(arg2, "-"))
	{

		if (victim->pcdata->temp_history_buffer == nullptr || victim->pcdata->temp_history_buffer[0] == '\0')
		{
			send_to_char("No lines left to remove.\n\r", ch);
			return;
		}

		strcpy(obuf, victim->pcdata->temp_history_buffer);

		for (len = strlen(obuf); len > 0; len--)
		{
			if (obuf[len] == '\r')
			{
				if (!found)
				{
					if (len > 0)
					{
						len--;
					}
					found = true;
				}
				else
				{
					obuf[len + 1] = '\0';
					free_pstring(victim->pcdata->temp_history_buffer);
					victim->pcdata->temp_history_buffer = palloc_string(obuf);
					show_temp_history(ch, victim);
					return;
				}
			}
		}

		obuf[0] = '\0';

		free_pstring(victim->pcdata->temp_history_buffer);
		victim->pcdata->temp_history_buffer = palloc_string(obuf);

		show_temp_history(ch, victim);
	}
}